

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inet_address.cpp
# Opt level: O0

result<sockpp::inet_address> *
sockpp::inet_address::create
          (result<sockpp::inet_address> *__return_storage_ptr__,string *saddr,in_port_t port)

{
  bool bVar1;
  uint16_t uVar2;
  char *__s;
  error_code *err;
  uint *puVar3;
  inet_address local_90;
  undefined1 auStack_78 [8];
  sockaddr_in addr;
  allocator<char> local_59;
  string local_58;
  undefined1 local_38 [8];
  result<unsigned_int> res;
  in_port_t port_local;
  string *saddr_local;
  
  res.err_._M_cat._6_2_ = port;
  __s = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,__s,&local_59);
  resolve_name((result<unsigned_int> *)local_38,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  bVar1 = sockpp::result::operator_cast_to_bool((result *)local_38);
  if (bVar1) {
    addr.sin_family = 0;
    addr.sin_port = 0;
    addr.sin_addr.s_addr = 0;
    auStack_78._0_2_ = 2;
    auStack_78._2_2_ = 0;
    auStack_78._4_4_ = 0;
    puVar3 = result<unsigned_int>::value((result<unsigned_int> *)local_38);
    auStack_78._4_4_ = *puVar3;
    uVar2 = htons(res.err_._M_cat._6_2_);
    auStack_78._2_2_ = uVar2;
    inet_address(&local_90,(sockaddr_in *)auStack_78);
    result<sockpp::inet_address>::result(__return_storage_ptr__,&local_90);
    ~inet_address(&local_90);
  }
  else {
    err = result<unsigned_int>::error((result<unsigned_int> *)local_38);
    result<sockpp::inet_address>::result(__return_storage_ptr__,err);
  }
  return __return_storage_ptr__;
}

Assistant:

result<inet_address> inet_address::create(const string& saddr, in_port_t port) noexcept {
    auto res = resolve_name(saddr.c_str());
    if (!res)
        return res.error();

    auto addr = sockaddr_in{};
    addr.sin_family = AF_INET;
    addr.sin_addr.s_addr = res.value();
    addr.sin_port = htons(port);
#if defined(__APPLE__) || defined(BSD)
    addr.sin_len = (uint8_t)SZ;
#endif
    return inet_address{addr};
}